

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

void bfgs_iter_middle<dense_parameters>
               (vw *all,bfgs *b,float *mem,double *rho,double *alpha,int *lastj,int *origin,
               dense_parameters *weights)

{
  float fVar1;
  float fVar2;
  float fVar3;
  weight *pwVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  float fVar8;
  uint32_t uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  undefined8 *puVar13;
  byte bVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  anon_union_4_2_947300a4 x;
  double dVar18;
  float fVar19;
  double dVar20;
  
  if (b->m == 0) {
    bVar14 = (byte)weights->_stride_shift;
    uVar17 = 1L << (bVar14 & 0x3f);
    pwVar4 = weights->_begin;
    if (pwVar4 == pwVar4 + weights->_weight_mask + 1) {
      fVar19 = NAN;
    }
    else {
      fVar19 = 0.0;
      fVar8 = 0.0;
      lVar16 = 0;
      do {
        fVar1 = *(float *)((long)pwVar4 + lVar16 + 4);
        fVar2 = mem[(long)(*origin % b->mem_stride) +
                    ((ulong)(lVar16 >> 2) >> (bVar14 & 0x3f)) * (long)b->mem_stride];
        fVar3 = *(float *)((long)pwVar4 + lVar16 + 0xc);
        fVar19 = fVar19 + (fVar1 - fVar2) * fVar3 * fVar1;
        fVar8 = fVar8 + fVar2 * fVar3 * fVar2;
        lVar16 = lVar16 + uVar17 * 4;
      } while (weights->_weight_mask * 4 + 4 != lVar16);
      fVar19 = fVar19 / fVar8;
    }
    if ((fVar19 < 0.0) || ((~(uint)fVar19 & 0x7fc00000) == 0)) {
      fVar19 = 0.0;
    }
    if (pwVar4 != weights->_begin + weights->_weight_mask + 1) {
      lVar16 = 0;
      do {
        mem[((ulong)(lVar16 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * (long)b->mem_stride +
            (long)(*origin % b->mem_stride)] = *(float *)((long)pwVar4 + lVar16 + 4);
        *(float *)((long)pwVar4 + lVar16 + 8) =
             *(float *)((long)pwVar4 + lVar16 + 8) * fVar19 -
             *(float *)((long)pwVar4 + lVar16 + 0xc) * *(float *)((long)pwVar4 + lVar16 + 4);
        *(undefined4 *)((long)pwVar4 + lVar16 + 4) = 0;
        lVar16 = lVar16 + (uVar17 & 0xffffffff) * 4;
      } while ((weight *)((long)pwVar4 + lVar16) != weights->_begin + weights->_weight_mask + 1);
    }
    if (all->quiet == false) {
      bfgs_iter_middle<dense_parameters>();
    }
  }
  else {
    if (all->quiet == false) {
      bfgs_iter_middle<dense_parameters>();
    }
    pwVar4 = weights->_begin;
    if (pwVar4 == pwVar4 + weights->_weight_mask + 1) {
      dVar6 = 0.0;
      dVar7 = 0.0;
      dVar18 = 0.0;
    }
    else {
      uVar9 = weights->_stride_shift;
      dVar6 = 0.0;
      dVar7 = 0.0;
      dVar18 = 0.0;
      lVar16 = 0;
      do {
        lVar11 = ((ulong)(lVar16 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) *
                 (long)b->mem_stride;
        lVar12 = (long)(*origin % b->mem_stride);
        mem[lVar11 + lVar12] = *(float *)((long)pwVar4 + lVar16 + 4) - mem[lVar11 + lVar12];
        lVar12 = (long)((*origin + 1) % b->mem_stride);
        mem[lVar11 + lVar12] = *(float *)((long)pwVar4 + lVar16) - mem[lVar11 + lVar12];
        fVar19 = *(float *)((long)pwVar4 + lVar16 + 4);
        *(float *)((long)pwVar4 + lVar16 + 8) = fVar19;
        dVar20 = (double)mem[lVar11 + *origin % b->mem_stride];
        dVar6 = dVar6 + dVar20 * dVar20 * (double)*(float *)((long)pwVar4 + lVar16 + 0xc);
        dVar7 = dVar7 + dVar20 * (double)mem[lVar11 + (*origin + 1) % b->mem_stride];
        dVar18 = dVar18 + (double)mem[lVar11 + (*origin + 1) % b->mem_stride] * (double)fVar19;
        lVar16 = lVar16 + (1L << ((byte)uVar9 & 0x3f)) * 4;
      } while ((weight *)((long)pwVar4 + lVar16) != weights->_begin + weights->_weight_mask + 1);
    }
    if ((dVar7 <= 0.0) || (dVar6 <= 0.0)) {
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = &PTR__exception_002d2a50;
      __cxa_throw(puVar13,&curv_exception::typeinfo,std::exception::~exception);
    }
    *rho = 1.0 / dVar7;
    iVar10 = *lastj;
    if (0 < iVar10) {
      lVar16 = 0;
      do {
        alpha[lVar16] = dVar18 * rho[lVar16];
        pwVar4 = weights->_begin;
        if (pwVar4 == pwVar4 + weights->_weight_mask + 1) {
          dVar18 = 0.0;
        }
        else {
          uVar9 = weights->_stride_shift;
          dVar18 = 0.0;
          lVar11 = 0;
          do {
            lVar12 = ((ulong)(lVar11 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) *
                     (long)b->mem_stride;
            fVar19 = *(float *)((long)pwVar4 + lVar11 + 8) -
                     (float)alpha[lVar16] *
                     mem[lVar12 + (*origin + (int)lVar16 * 2) % b->mem_stride];
            *(float *)((long)pwVar4 + lVar11 + 8) = fVar19;
            dVar18 = dVar18 + (double)fVar19 *
                              (double)mem[lVar12 + (*origin + (int)lVar16 * 2 + 3) % b->mem_stride];
            lVar11 = lVar11 + (1L << ((byte)uVar9 & 0x3f)) * 4;
          } while ((weight *)((long)pwVar4 + lVar11) != weights->_begin + weights->_weight_mask + 1)
          ;
        }
        lVar16 = lVar16 + 1;
        iVar10 = *lastj;
      } while (lVar16 < iVar10);
    }
    alpha[iVar10] = dVar18 * rho[iVar10];
    pwVar4 = weights->_begin;
    if (pwVar4 == pwVar4 + weights->_weight_mask + 1) {
      dVar18 = 0.0;
    }
    else {
      uVar9 = weights->_stride_shift;
      dVar18 = 0.0;
      lVar16 = 0;
      do {
        lVar11 = ((ulong)(lVar16 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) *
                 (long)b->mem_stride;
        fVar19 = *(float *)((long)pwVar4 + lVar16 + 0xc) * (float)(dVar7 / dVar6) *
                 (*(float *)((long)pwVar4 + lVar16 + 8) -
                 (float)alpha[*lastj] * mem[lVar11 + (*lastj * 2 + *origin) % b->mem_stride]);
        *(float *)((long)pwVar4 + lVar16 + 8) = fVar19;
        dVar18 = dVar18 + (double)fVar19 *
                          (double)mem[lVar11 + (*lastj * 2 + *origin) % b->mem_stride];
        lVar16 = lVar16 + (1L << ((byte)uVar9 & 0x3f)) * 4;
      } while ((weight *)((long)pwVar4 + lVar16) != weights->_begin + weights->_weight_mask + 1);
    }
    lVar16 = (long)*lastj;
    if (0 < (long)*lastj) {
      do {
        pwVar4 = weights->_begin;
        if (pwVar4 == pwVar4 + weights->_weight_mask + 1) {
          dVar18 = 0.0;
        }
        else {
          uVar9 = weights->_stride_shift;
          dVar6 = alpha[lVar16];
          dVar7 = dVar18 * rho[lVar16];
          dVar18 = 0.0;
          lVar11 = 0;
          do {
            lVar12 = ((ulong)(lVar11 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) *
                     (long)b->mem_stride;
            fVar19 = mem[lVar12 + (*origin + (int)lVar16 * 2 + 1) % b->mem_stride] *
                     (float)(dVar6 - dVar7) + *(float *)((long)pwVar4 + lVar11 + 8);
            *(float *)((long)pwVar4 + lVar11 + 8) = fVar19;
            dVar18 = dVar18 + (double)fVar19 *
                              (double)mem[lVar12 + (*origin + (int)lVar16 * 2 + -2) % b->mem_stride]
            ;
            lVar11 = lVar11 + (1L << ((byte)uVar9 & 0x3f)) * 4;
          } while ((weight *)((long)pwVar4 + lVar11) != weights->_begin + weights->_weight_mask + 1)
          ;
        }
        bVar5 = 1 < lVar16;
        lVar16 = lVar16 + -1;
      } while (bVar5);
    }
    pwVar4 = weights->_begin;
    if (pwVar4 != pwVar4 + weights->_weight_mask + 1) {
      uVar9 = weights->_stride_shift;
      dVar6 = *rho;
      dVar7 = *alpha;
      lVar16 = 0;
      do {
        *(float *)((long)pwVar4 + lVar16 + 8) =
             mem[((ulong)(lVar16 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) *
                 (long)b->mem_stride + (long)((*origin + 1) % b->mem_stride)] *
             -(float)(dVar7 - dVar18 * dVar6) - *(float *)((long)pwVar4 + lVar16 + 8);
        lVar16 = lVar16 + (1L << ((byte)uVar9 & 0x3f)) * 4;
      } while ((weight *)((long)pwVar4 + lVar16) != weights->_begin + weights->_weight_mask + 1);
    }
    iVar15 = b->m + -1;
    iVar10 = *lastj + 1;
    if (iVar15 <= *lastj) {
      iVar10 = iVar15;
    }
    *lastj = iVar10;
    *origin = (*origin + b->mem_stride + -2) % b->mem_stride;
    pwVar4 = weights->_begin;
    if (pwVar4 != pwVar4 + weights->_weight_mask + 1) {
      uVar9 = weights->_stride_shift;
      lVar16 = 0;
      do {
        lVar11 = ((ulong)(lVar16 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) *
                 (long)b->mem_stride;
        mem[lVar11 + *origin % b->mem_stride] = *(float *)((long)pwVar4 + lVar16 + 4);
        mem[lVar11 + (*origin + 1) % b->mem_stride] = *(float *)((long)pwVar4 + lVar16);
        *(undefined4 *)((long)pwVar4 + lVar16 + 4) = 0;
        lVar16 = lVar16 + (1L << ((byte)uVar9 & 0x3f)) * 4;
      } while ((weight *)((long)pwVar4 + lVar16) != weights->_begin + weights->_weight_mask + 1);
    }
    if (0 < (long)*lastj) {
      lVar16 = (long)*lastj + 1;
      do {
        rho[lVar16 + -1] = rho[lVar16 + -2];
        lVar16 = lVar16 + -1;
      } while (1 < lVar16);
    }
  }
  return;
}

Assistant:

void bfgs_iter_middle(vw& all, bfgs& b, float* mem, double* rho, double* alpha, int& lastj, int& origin, T& weights)
{
  float* mem0 = mem;
  uint32_t length = 1 << all.num_bits;
  // implement conjugate gradient
  if (b.m == 0)
  {
    double g_Hy = 0.;
    double g_Hg = 0.;
    double y = 0.;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      y = (&(*w))[W_GT] - mem[(MEM_GT + origin) % b.mem_stride];
      g_Hy += ((double)(&(*w))[W_GT]) * ((&(*w))[W_COND]) * y;
      g_Hg +=
          ((double)mem[(MEM_GT + origin) % b.mem_stride]) * ((&(*w))[W_COND]) * mem[(MEM_GT + origin) % b.mem_stride];
    }

    float beta = (float)(g_Hy / g_Hg);

    if (beta < 0.f || nanpattern(beta))
      beta = 0.f;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];

      (&(*w))[W_DIR] *= beta;
      (&(*w))[W_DIR] -= ((&(*w))[W_COND]) * ((&(*w))[W_GT]);
      (&(*w))[W_GT] = 0;
    }
    if (!all.quiet)
      fprintf(stderr, "%f\t", beta);
    return;

    mem = mem0 + (length - 1) * b.mem_stride;
  }
  else
  {
    if (!all.quiet)
      fprintf(stderr, "%-10s\t", "");
  }

  // implement bfgs
  double y_s = 0.;
  double y_Hy = 0.;
  double s_q = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem1[(MEM_YT + origin) % b.mem_stride] = (&(*w))[W_GT] - mem1[(MEM_GT + origin) % b.mem_stride];
    mem1[(MEM_ST + origin) % b.mem_stride] = (&(*w))[W_XT] - mem1[(MEM_XT + origin) % b.mem_stride];
    (&(*w))[W_DIR] = (&(*w))[W_GT];
    y_s += ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_ST + origin) % b.mem_stride];
    y_Hy +=
        ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_YT + origin) % b.mem_stride] * ((&(*w))[W_COND]);
    s_q += ((double)mem1[(MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_GT]);
  }

  if (y_s <= 0. || y_Hy <= 0.)
    throw curv_ex;
  rho[0] = 1 / y_s;

  float gamma = (float)(y_s / y_Hy);

  for (int j = 0; j < lastj; j++)
  {
    alpha[j] = rho[j] * s_q;
    s_q = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] -= (float)alpha[j] * mem[(2 * j + MEM_YT + origin) % b.mem_stride];
      s_q += ((double)mem[(2 * j + 2 + MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  alpha[lastj] = rho[lastj] * s_q;
  double y_r = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] -= (float)alpha[lastj] * mem[(2 * lastj + MEM_YT + origin) % b.mem_stride];
    (&(*w))[W_DIR] *= gamma * ((&(*w))[W_COND]);
    y_r += ((double)mem[(2 * lastj + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
  }

  double coef_j;

  for (int j = lastj; j > 0; j--)
  {
    coef_j = alpha[j] - rho[j] * y_r;
    y_r = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] += (float)coef_j * mem[(2 * j + MEM_ST + origin) % b.mem_stride];
      y_r += ((double)mem[(2 * j - 2 + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  coef_j = alpha[0] - rho[0] * y_r;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] = -(&(*w))[W_DIR] - (float)coef_j * mem[(MEM_ST + origin) % b.mem_stride];
  }

  /*********************
  ** shift
  ********************/

  lastj = (lastj < b.m - 1) ? lastj + 1 : b.m - 1;
  origin = (origin + b.mem_stride - 2) % b.mem_stride;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];
    mem[(MEM_XT + origin) % b.mem_stride] = (&(*w))[W_XT];
    (&(*w))[W_GT] = 0;
  }
  for (int j = lastj; j > 0; j--) rho[j] = rho[j - 1];
}